

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.cpp
# Opt level: O3

InfoStatus
checkInfo(HighsLogOptions *report_log_options,
         vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *info_records)

{
  HighsInfoType HVar1;
  InfoRecord *pIVar2;
  pointer pcVar3;
  _func_int **pp_Var4;
  InfoRecord *pIVar5;
  undefined1 *puVar6;
  bool bVar7;
  int iVar8;
  undefined1 *puVar9;
  HighsInt check_index;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  string name;
  string check_name;
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  uVar11 = (uint)((ulong)((long)(info_records->
                                super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(info_records->
                               super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar11) {
    uVar12 = (ulong)(uVar11 & 0x7fffffff);
    uVar13 = 0;
    bVar7 = false;
    do {
      local_70 = local_60;
      pIVar2 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar13];
      pcVar3 = (pIVar2->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar3,pcVar3 + (pIVar2->name)._M_string_length);
      HVar1 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>).
              _M_impl.super__Vector_impl_data._M_start[uVar13]->type;
      uVar10 = 0;
      do {
        if (uVar13 != uVar10) {
          pIVar2 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar10];
          local_50 = local_40;
          pcVar3 = (pIVar2->name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar3,pcVar3 + (pIVar2->name)._M_string_length);
          puVar9 = local_50;
          puVar6 = local_70;
          if ((local_48 == local_68) &&
             ((local_48 == 0 || (iVar8 = bcmp(local_50,local_70,local_48), iVar8 == 0)))) {
            highsLogUser(report_log_options,kError,
                         "checkInfo: Info %d (\"%s\") has the same name as info %d \"%s\"\n",
                         uVar13 & 0xffffffff,puVar6,uVar10 & 0xffffffff,puVar9);
            bVar7 = true;
            puVar9 = local_50;
          }
          if (puVar9 != local_40) {
            operator_delete(puVar9);
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
      if (HVar1 == kInt64) {
        pIVar2 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar13];
        pp_Var4 = pIVar2[1]._vptr_InfoRecord;
        uVar10 = 0;
        do {
          if (((uVar13 != uVar10) &&
              (pIVar5 = (info_records->
                        super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar10], pIVar5->type == kInt64)) &&
             (pIVar5[1]._vptr_InfoRecord == pp_Var4)) {
            bVar7 = true;
            highsLogUser(report_log_options,kError,
                         "checkInfo: Info %d (\"%s\") has the same value pointer as info %d (\"%s\")\n"
                         ,uVar13 & 0xffffffff,(pIVar2->name)._M_dataplus._M_p,uVar10 & 0xffffffff,
                         (pIVar5->name)._M_dataplus._M_p);
          }
          uVar10 = uVar10 + 1;
        } while (uVar12 != uVar10);
      }
      else if (HVar1 == kInt) {
        pIVar2 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar13];
        pp_Var4 = pIVar2[1]._vptr_InfoRecord;
        uVar10 = 0;
        do {
          if (((uVar13 != uVar10) &&
              (pIVar5 = (info_records->
                        super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar10], pIVar5->type == kInt)) &&
             (pIVar5[1]._vptr_InfoRecord == pp_Var4)) {
            bVar7 = true;
            highsLogUser(report_log_options,kError,
                         "checkInfo: Info %d (\"%s\") has the same value pointer as info %d (\"%s\")\n"
                         ,uVar13 & 0xffffffff,(pIVar2->name)._M_dataplus._M_p,uVar10 & 0xffffffff,
                         (pIVar5->name)._M_dataplus._M_p);
          }
          uVar10 = uVar10 + 1;
        } while (uVar12 != uVar10);
      }
      else if (HVar1 == kDouble) {
        pIVar2 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar13];
        pp_Var4 = pIVar2[1]._vptr_InfoRecord;
        uVar10 = 0;
        do {
          if (((uVar13 != uVar10) &&
              (pIVar5 = (info_records->
                        super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar10], pIVar5->type == kDouble)) &&
             (pIVar5[1]._vptr_InfoRecord == pp_Var4)) {
            bVar7 = true;
            highsLogUser(report_log_options,kError,
                         "checkInfo: Info %d (\"%s\") has the same value pointer as info %d (\"%s\")\n"
                         ,uVar13 & 0xffffffff,(pIVar2->name)._M_dataplus._M_p,uVar10 & 0xffffffff,
                         (pIVar5->name)._M_dataplus._M_p);
          }
          uVar10 = uVar10 + 1;
        } while (uVar12 != uVar10);
      }
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar12);
    if (bVar7) {
      return kIllegalValue;
    }
  }
  highsLogUser(report_log_options,kInfo,"checkInfo: Info are OK\n");
  return kOk;
}

Assistant:

InfoStatus checkInfo(const HighsLogOptions& report_log_options,
                     const std::vector<InfoRecord*>& info_records) {
  bool error_found = false;
  HighsInt num_info = info_records.size();
  for (HighsInt index = 0; index < num_info; index++) {
    std::string name = info_records[index]->name;
    HighsInfoType type = info_records[index]->type;
    // Check that there are no other info with the same name
    for (HighsInt check_index = 0; check_index < num_info; check_index++) {
      if (check_index == index) continue;
      std::string check_name = info_records[check_index]->name;
      if (check_name == name) {
        highsLogUser(report_log_options, HighsLogType::kError,
                     "checkInfo: Info %" HIGHSINT_FORMAT
                     " (\"%s\") has the same name as info %" HIGHSINT_FORMAT
                     " \"%s\"\n",
                     index, name.c_str(), check_index, check_name.c_str());
        error_found = true;
      }
    }
    if (type == HighsInfoType::kInt64) {
      // Check int64_t info
      InfoRecordInt64& info = ((InfoRecordInt64*)info_records[index])[0];
      // Check that there are no other info with the same value pointers
      int64_t* value_pointer = info.value;
      for (HighsInt check_index = 0; check_index < num_info; check_index++) {
        if (check_index == index) continue;
        InfoRecordInt64& check_info =
            ((InfoRecordInt64*)info_records[check_index])[0];
        if (check_info.type == HighsInfoType::kInt64) {
          if (check_info.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkInfo: Info %" HIGHSINT_FORMAT
                         " (\"%s\") has the same value "
                         "pointer as info %" HIGHSINT_FORMAT " (\"%s\")\n",
                         index, info.name.c_str(), check_index,
                         check_info.name.c_str());
            error_found = true;
          }
        }
      }
    } else if (type == HighsInfoType::kInt) {
      // Check HighsInt info
      InfoRecordInt& info = ((InfoRecordInt*)info_records[index])[0];
      // Check that there are no other info with the same value pointers
      HighsInt* value_pointer = info.value;
      for (HighsInt check_index = 0; check_index < num_info; check_index++) {
        if (check_index == index) continue;
        InfoRecordInt& check_info =
            ((InfoRecordInt*)info_records[check_index])[0];
        if (check_info.type == HighsInfoType::kInt) {
          if (check_info.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkInfo: Info %" HIGHSINT_FORMAT
                         " (\"%s\") has the same value "
                         "pointer as info %" HIGHSINT_FORMAT " (\"%s\")\n",
                         index, info.name.c_str(), check_index,
                         check_info.name.c_str());
            error_found = true;
          }
        }
      }
    } else if (type == HighsInfoType::kDouble) {
      // Check double info
      InfoRecordDouble& info = ((InfoRecordDouble*)info_records[index])[0];
      // Check that there are no other info with the same value pointers
      double* value_pointer = info.value;
      for (HighsInt check_index = 0; check_index < num_info; check_index++) {
        if (check_index == index) continue;
        InfoRecordDouble& check_info =
            ((InfoRecordDouble*)info_records[check_index])[0];
        if (check_info.type == HighsInfoType::kDouble) {
          if (check_info.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkInfo: Info %" HIGHSINT_FORMAT
                         " (\"%s\") has the same value "
                         "pointer as info %" HIGHSINT_FORMAT " (\"%s\")\n",
                         index, info.name.c_str(), check_index,
                         check_info.name.c_str());
            error_found = true;
          }
        }
      }
    }
  }
  if (error_found) return InfoStatus::kIllegalValue;
  highsLogUser(report_log_options, HighsLogType::kInfo,
               "checkInfo: Info are OK\n");
  return InfoStatus::kOk;
}